

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void jpgd::jpeg_decoder::decode_block_dc_refine
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  coeff_buf *pcVar1;
  uint uVar2;
  
  uVar2 = get_bits_no_markers(pD,1);
  if (uVar2 != 0) {
    pcVar1 = pD->m_dc_coeffs[component_id];
    if ((pcVar1->block_num_x <= block_x) || (pcVar1->block_num_y <= block_y)) {
      stop_decoding(pD,JPGD_DECODE_ERROR);
    }
    *(ushort *)
     (pcVar1->pData +
     (long)(pcVar1->block_num_x * block_y * pcVar1->block_size) +
     (long)(block_x * pcVar1->block_size)) =
         *(ushort *)
          (pcVar1->pData +
          (long)(pcVar1->block_num_x * block_y * pcVar1->block_size) +
          (long)(block_x * pcVar1->block_size)) | (ushort)(1 << ((byte)pD->m_successive_low & 0x1f))
    ;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_dc_refine(jpeg_decoder* pD, int component_id, int block_x, int block_y)
	{
		if (pD->get_bits_no_markers(1))
		{
			jpgd_block_coeff_t* p = pD->coeff_buf_getp(pD->m_dc_coeffs[component_id], block_x, block_y);

			p[0] |= (1 << pD->m_successive_low);
		}
	}